

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  uint uVar1;
  size_t code;
  size_t err_code;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_DCtx *dctx_local;
  
  dctx_local = (ZSTD_DCtx *)ZSTD_decompressBegin(dctx);
  uVar1 = ERR_isError((size_t)dctx_local);
  if (uVar1 == 0) {
    if ((dict != (void *)0x0) && (dictSize != 0)) {
      code = ZSTD_decompress_insertDictionary(dctx,dict,dictSize);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        return 0xffffffffffffffe2;
      }
    }
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    FORWARD_IF_ERROR( ZSTD_decompressBegin(dctx) , "");
    if (dict && dictSize)
        RETURN_ERROR_IF(
            ZSTD_isError(ZSTD_decompress_insertDictionary(dctx, dict, dictSize)),
            dictionary_corrupted, "");
    return 0;
}